

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuArch.c
# Opt level: O0

BoolInt CPU_IsSupported_AVX2(void)

{
  BoolInt BVar1;
  UInt32 UVar2;
  UInt32 local_28;
  uint local_24;
  UInt32 d [4];
  uint local_c;
  
  BVar1 = CPU_IsSupported_AVX();
  if (BVar1 == 0) {
    local_c = 0;
  }
  else {
    UVar2 = z7_x86_cpuid_GetMaxFunc();
    if (UVar2 < 7) {
      local_c = 0;
    }
    else {
      z7_x86_cpuid(&local_28,7);
      local_c = local_24 >> 5 & 1;
    }
  }
  return local_c;
}

Assistant:

BoolInt CPU_IsSupported_AVX2(void)
{
  if (!CPU_IsSupported_AVX())
    return False;
  if (z7_x86_cpuid_GetMaxFunc() < 7)
    return False;
  {
    UInt32 d[4];
    z7_x86_cpuid(d, 7);
    // printf("\ncpuid(7): ebx=%8x ecx=%8x\n", d[1], d[2]);
    return 1
      & (BoolInt)(d[1] >> 5); // avx2
  }
}